

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

bool lexer_CaptureMacroBody(CaptureBody *capture)

{
  LexerState *pLVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  startCapture(capture);
  pLVar1 = lexerState;
  if (lexerState->isMmapped == true) {
    (lexerState->field_2).field_0.isReferenced = true;
  }
  if (pLVar1->atLineStart != true) {
    __assert_fail("lexerState->atLineStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,0x9f7,"lexer_CaptureMacroBody");
  }
LAB_0010e038:
  do {
    pLVar1 = lexerState;
    lexerState->lineNo = lexerState->lineNo + 1;
    pLVar1->colNo = 1;
    do {
      uVar2 = peek();
      if (uVar2 == 0xffffffff) break;
      shiftChar();
    } while ((uVar2 == 0x20) || (uVar2 == 9));
    if (((uVar2 & 0xffffffdf) - 0x41 < 0x1a) || ((uVar2 == 0x5f || (uVar2 == 0x2e)))) {
      iVar3 = readIdentifier((char)uVar2);
      if (iVar3 == 0x6c) {
        lexerState->captureSize = lexerState->captureSize - 4;
        bVar4 = uVar2 != 0xffffffff;
LAB_0010e0d7:
        if (capture->body == (char *)0x0) {
          capture->body = lexerState->captureBuf;
        }
        pLVar1 = lexerState;
        capture->size = lexerState->captureSize;
        pLVar1->capturing = false;
        pLVar1->captureBuf = (char *)0x0;
        pLVar1->disableMacroArgs = false;
        pLVar1->disableInterpolation = false;
        pLVar1->atLineStart = false;
        return bVar4;
      }
    }
    while (uVar2 != 0xd) {
      if (uVar2 == 10) goto LAB_0010e038;
      if (uVar2 == 0xffffffff) {
        bVar4 = false;
        error("Unterminated macro definition\n");
        goto LAB_0010e0d7;
      }
      uVar2 = peek();
      if (uVar2 != 0xffffffff) {
        shiftChar();
      }
    }
    iVar3 = peek();
    if (iVar3 == 10) {
      shiftChar();
    }
  } while( true );
}

Assistant:

bool lexer_CaptureMacroBody(struct CaptureBody *capture)
{
	startCapture(capture);

	// If the file is `mmap`ed, we need not to unmap it to keep access to the macro
	if (lexerState->isMmapped)
		lexerState->isReferenced = true;

	int c = EOF;

	// Due to parser internals, it reads the EOL after the expression before calling this.
	// Thus, we don't need to keep one in the buffer afterwards.
	// The following assertion checks that.
	assert(lexerState->atLineStart);
	for (;;) {
		nextLine();
		// We're at line start, so attempt to match an `ENDM` token
		do { // Discard initial whitespace
			c = nextChar();
		} while (isWhitespace(c));
		// Now, try to match `ENDM` as a **whole** identifier
		if (startsIdentifier(c)) {
			switch (readIdentifier(c)) {
			case T_POP_ENDM:
				// The ENDM has been captured, but we don't want it!
				// We know we have read exactly "ENDM", not e.g. an EQUS
				lexerState->captureSize -= strlen("ENDM");
				goto finish;
			}
		}

		// Just consume characters until EOL or EOF
		for (;; c = nextChar()) {
			if (c == EOF) {
				error("Unterminated macro definition\n");
				goto finish;
			} else if (c == '\n' || c == '\r') {
				handleCRLF(c);
				break;
			}
		}
	}

finish:
	endCapture(capture);
	// ENDM or EOF puts us past the start of the line
	lexerState->atLineStart = false;

	// Returns true if an ENDM terminated the block, false if it reached EOF first
	return c != EOF;
}